

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O0

void vkt::addFunctionCaseWithPrograms<vkt::pipeline::(anonymous_namespace)::CaseDef>
               (TestCaseGroup *group,string *name,string *desc,Function_conflict1 initPrograms,
               Function_conflict1 testFunc,CaseDef_conflict1 *arg0)

{
  CaseDef_conflict1 *testFunction;
  Function_conflict1 initPrograms_00;
  Function_conflict1 desc_00;
  string *name_00;
  TestContext *testCtx;
  TestNode *node;
  CaseDef_conflict1 local_5c;
  CaseDef_conflict1 *local_38;
  CaseDef_conflict1 *arg0_local;
  Function_conflict1 testFunc_local;
  Function_conflict1 initPrograms_local;
  string *desc_local;
  string *name_local;
  TestCaseGroup *group_local;
  
  local_38 = arg0;
  arg0_local = (CaseDef_conflict1 *)testFunc;
  testFunc_local = (Function_conflict1)initPrograms;
  initPrograms_local = (Function_conflict1)desc;
  desc_local = name;
  name_local = (string *)group;
  testCtx = tcu::TestNode::getTestContext(&group->super_TestNode);
  name_00 = desc_local;
  desc_00 = initPrograms_local;
  initPrograms_00 = testFunc_local;
  testFunction = arg0_local;
  pipeline::anon_unknown_0::CaseDef::CaseDef((CaseDef *)&local_5c,arg0);
  node = (TestNode *)
         createFunctionCaseWithPrograms<vkt::pipeline::(anonymous_namespace)::CaseDef>
                   (testCtx,NODETYPE_SELF_VALIDATE,name_00,(string *)desc_00,
                    (Function_conflict1)initPrograms_00,(Function_conflict1)testFunction,&local_5c);
  tcu::TestNode::addChild(&group->super_TestNode,node);
  return;
}

Assistant:

void addFunctionCaseWithPrograms (tcu::TestCaseGroup*							group,
								  const std::string&							name,
								  const std::string&							desc,
								  typename FunctionPrograms1<Arg0>::Function	initPrograms,
								  typename FunctionInstance1<Arg0>::Function	testFunc,
								  Arg0											arg0)
{
	group->addChild(createFunctionCaseWithPrograms<Arg0>(group->getTestContext(), tcu::NODETYPE_SELF_VALIDATE, name, desc, initPrograms, testFunc, arg0));
}